

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

TValue * luaH_getnum(Table *t,int key)

{
  double n_00;
  Node *local_30;
  Node *n;
  lua_Number nk;
  int key_local;
  Table *t_local;
  
  if (key - 1U < (uint)t->sizearray) {
    t_local = (Table *)(t->array + (key + -1));
  }
  else {
    n_00 = (double)key;
    local_30 = hashnum(t,n_00);
    do {
      if ((local_30->i_key).nk.tt == 3) {
        if ((*(double *)&local_30->i_key == n_00) &&
           (!NAN(*(double *)&local_30->i_key) && !NAN(n_00))) {
          return &local_30->i_val;
        }
      }
      local_30 = (local_30->i_key).nk.next;
    } while (local_30 != (Node *)0x0);
    t_local = (Table *)&luaO_nilobject_;
  }
  return (TValue *)t_local;
}

Assistant:

static const TValue*luaH_getnum(Table*t,int key){
if(cast(unsigned int,key)-1<cast(unsigned int,t->sizearray))
return&t->array[key-1];
else{
lua_Number nk=cast_num(key);
Node*n=hashnum(t,nk);
do{
if(ttisnumber(gkey(n))&&luai_numeq(nvalue(gkey(n)),nk))
return gval(n);
else n=gnext(n);
}while(n);
return(&luaO_nilobject_);
}
}